

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Pivot.c
# Opt level: O2

int Llb_ManTracePaths_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Aig_Obj_t *pPivot)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Aig_Obj_t *pObj_00;
  char *__assertion;
  uint uVar4;
  
  iVar1 = 0;
  if ((pObj->TravId != p->nTravIds + -1) && (iVar1 = 1, pObj->TravId != p->nTravIds)) {
    uVar3 = (uint)*(undefined8 *)&pObj->field_0x18;
    if ((uVar3 & 7) == 3) {
      iVar1 = Aig_ObjCioId(pObj);
      if (p->nTruePos <= iVar1) {
        return 0;
      }
      uVar3 = (uint)*(undefined8 *)&pObj->field_0x18;
    }
    if ((((uVar3 & 7) != 3) || (iVar2 = Aig_ObjCioId(pObj), iVar1 = 0, p->nTruePos <= iVar2)) &&
       (iVar1 = 1, pObj != pPivot)) {
      uVar3 = *(uint *)&pObj->field_0x18 & 7;
      if ((uVar3 < 7) && ((100U >> uVar3 & 1) != 0)) {
        if (p->pFanData != (int *)0x0) {
          uVar3 = 0xffffffff;
          uVar4 = 0;
          do {
            if (*(uint *)&pObj->field_0x18 >> 6 <= uVar4) {
              iVar1 = p->nTravIds;
              iVar2 = 1;
              goto LAB_0069c716;
            }
            if (uVar4 == 0) {
              if (p->nFansAlloc <= pObj->Id) {
                __assert_fail("ObjId < p->nFansAlloc",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                              ,0x1a8,"int Aig_ObjFanout0Int(Aig_Man_t *, int)");
              }
              iVar1 = pObj->Id * 5;
            }
            else {
              if (p->nFansAlloc <= (int)uVar3 / 2) {
                __assert_fail("iFan/2 < p->nFansAlloc",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                              ,0x1a9,"int Aig_ObjFanoutNext(Aig_Man_t *, int)");
              }
              iVar1 = ((int)uVar3 >> 1) * 5 + (uVar3 & 1) + 3;
            }
            uVar3 = p->pFanData[iVar1];
            if (p->vObjs == (Vec_Ptr_t *)0x0) {
              pObj_00 = (Aig_Obj_t *)0x0;
            }
            else {
              pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,(int)uVar3 >> 1);
            }
            iVar1 = Llb_ManTracePaths_rec(p,pObj_00,pPivot);
            uVar4 = uVar4 + 1;
          } while (iVar1 != 0);
          iVar1 = p->nTravIds + -1;
          iVar2 = 0;
LAB_0069c716:
          pObj->TravId = iVar1;
          return iVar2;
        }
        __assertion = "p->pFanData";
        uVar3 = 0x3c;
      }
      else {
        __assertion = "Aig_ObjIsCand(pObj)";
        uVar3 = 0x3b;
      }
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb1Pivot.c"
                    ,uVar3,"int Llb_ManTracePaths_rec(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
    }
  }
  return iVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Llb_ManTracePaths_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Aig_Obj_t * pPivot )
{
    Aig_Obj_t * pFanout;
    int k, iFan = -1;
    if ( Aig_ObjIsTravIdPrevious(p, pObj) )
        return 0;
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return 1;
    if ( Saig_ObjIsLi(p, pObj) )
        return 0;
    if ( Saig_ObjIsPo(p, pObj) )
        return 0;
    if ( pObj == pPivot )
        return 1;
    assert( Aig_ObjIsCand(pObj) );
    Aig_ObjForEachFanout( p, pObj, pFanout, iFan, k )
        if ( !Llb_ManTracePaths_rec( p, pFanout, pPivot ) )
        {
            Aig_ObjSetTravIdPrevious(p, pObj);
            return 0;
        }
    Aig_ObjSetTravIdCurrent(p, pObj);
    return 1;
}